

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

int32_t __thiscall
charls::jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
::do_run_mode(jls_codec<charls::default_traits<unsigned_short,_unsigned_short>,_charls::encoder_strategy>
              *this,int32_t index,encoder_strategy *param_2)

{
  ushort uVar1;
  pixel_type *ppVar2;
  pixel_type *ppVar3;
  sample_type sVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint run_length;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  
  iVar5 = (this->traits_).near_lossless;
  ppVar2 = this->current_line_;
  ppVar3 = this->previous_line_;
  uVar10 = this->width_ - index;
  uVar1 = ppVar2[(long)index + -1];
  uVar8 = 0;
  do {
    iVar6 = (uint)ppVar2[(long)index + uVar8] - (uint)uVar1;
    iVar7 = -iVar6;
    if (0 < iVar6) {
      iVar7 = iVar6;
    }
    uVar9 = uVar8;
    if (iVar5 < iVar7) break;
    ppVar2[(long)index + uVar8] = uVar1;
    uVar8 = uVar8 + 1;
    uVar9 = (ulong)uVar10;
  } while (uVar10 != uVar8);
  run_length = (uint)uVar9;
  encode_run_pixels(this,run_length,run_length == uVar10);
  if (run_length != uVar10) {
    sVar4 = encode_run_interruption_pixel
                      (this,(uint)ppVar2[(long)index + (long)(int)run_length],(uint)uVar1,
                       (uint)ppVar3[(long)index + (long)(int)run_length]);
    ppVar2[(long)index + (long)(int)run_length] = sVar4;
    iVar5 = 1;
    if (1 < this->run_index_) {
      iVar5 = this->run_index_;
    }
    this->run_index_ = iVar5 + -1;
    uVar10 = run_length + 1;
  }
  return uVar10;
}

Assistant:

int32_t do_run_mode(const int32_t index, encoder_strategy* /*strategy*/)
    {
        const int32_t count_type_remain = width_ - index;
        pixel_type* type_cur_x{current_line_ + index};
        const pixel_type* type_prev_x{previous_line_ + index};

        const pixel_type ra{type_cur_x[-1]};

        int32_t run_length{};
        while (traits_.is_near(type_cur_x[run_length], ra))
        {
            type_cur_x[run_length] = ra;
            ++run_length;

            if (run_length == count_type_remain)
                break;
        }

        encode_run_pixels(run_length, run_length == count_type_remain);

        if (run_length == count_type_remain)
            return run_length;

        type_cur_x[run_length] = encode_run_interruption_pixel(type_cur_x[run_length], ra, type_prev_x[run_length]);
        decrement_run_index();
        return run_length + 1;
    }